

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Scanner::setError(Scanner *this,Twine *Message,iterator Position)

{
  error_code *peVar1;
  error_category *peVar2;
  
  if (this->End <= this->Current) {
    this->Current = this->End + -1;
  }
  peVar1 = this->EC;
  if (peVar1 != (error_code *)0x0) {
    peVar2 = (error_category *)std::_V2::generic_category();
    peVar1->_M_value = 0x16;
    peVar1->_M_cat = peVar2;
  }
  if (this->Failed == false) {
    printError(this,(SMLoc)this->Current,DK_Error,Message,(ArrayRef<llvm::SMRange>)ZEXT816(0));
  }
  this->Failed = true;
  return;
}

Assistant:

void setError(const Twine &Message, StringRef::iterator Position) {
    if (Current >= End)
      Current = End - 1;

    // propagate the error if possible
    if (EC)
      *EC = make_error_code(std::errc::invalid_argument);

    // Don't print out more errors after the first one we encounter. The rest
    // are just the result of the first, and have no meaning.
    if (!Failed)
      printError(SMLoc::getFromPointer(Current), SourceMgr::DK_Error, Message);
    Failed = true;
  }